

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool art_node_iterator_lower_bound(art_ref_t ref,art_iterator_t *iterator,art_key_chunk_t *key)

{
  _Bool _Var1;
  int iVar2;
  art_iterator_t *node;
  long in_RDX;
  long in_RSI;
  art_ref_t in_RDI;
  art_ref_t unaff_retaddr;
  art_leaf_t *leaf;
  art_indexed_child_t indexed_child;
  art_key_chunk_t key_chunk;
  int prefix_comparison;
  art_inner_node_t *inner_node;
  undefined6 in_stack_ffffffffffffffa8;
  uint8_t in_stack_ffffffffffffffae;
  uint8_t in_stack_ffffffffffffffaf;
  art_iterator_t *in_stack_ffffffffffffffb0;
  art_ref_t in_stack_ffffffffffffffb8;
  art_t *art;
  art_indexed_child_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined1 first;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  while( true ) {
    art = (art_t *)in_stack_ffffffffffffffc0.child;
    _Var1 = art_is_leaf(0x10c5fd);
    if (((_Var1 ^ 0xffU) & 1) == 0) {
      art_deref(art,in_stack_ffffffffffffffb8);
      iVar2 = art_compare_keys(in_stack_ffffffffffffffb0->key,
                               (art_key_chunk_t *)
                               CONCAT17(in_stack_ffffffffffffffaf,
                                        CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8
                                                )));
      if (iVar2 < 0) {
        _Var1 = art_iterator_up_and_move
                          ((art_iterator_t *)
                           CONCAT17(in_stack_ffffffffffffffaf,
                                    CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)),
                           false);
      }
      else {
        _Var1 = art_iterator_valid_loc
                          (in_stack_ffffffffffffffb0,
                           CONCAT17(in_stack_ffffffffffffffaf,
                                    CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)));
      }
      return _Var1;
    }
    node = (art_iterator_t *)art_deref(art,in_stack_ffffffffffffffb8);
    iVar2 = art_compare_prefix((art_key_chunk_t *)art,(uint8_t)(in_stack_ffffffffffffffb8 >> 0x38),
                               in_stack_ffffffffffffffb0->key,in_stack_ffffffffffffffaf,
                               in_stack_ffffffffffffffae);
    if (iVar2 < 0) {
      _Var1 = art_iterator_up_and_move
                        ((art_iterator_t *)
                         CONCAT17(in_stack_ffffffffffffffaf,
                                  CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)),
                         false);
      return _Var1;
    }
    if (0 < iVar2) {
      _Var1 = art_node_init_iterator
                        (unaff_retaddr,
                         (art_iterator_t *)
                         CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                         SUB81(in_RDI >> 0x38,0));
      return _Var1;
    }
    in_stack_ffffffffffffffd0 =
         CONCAT13(*(undefined1 *)
                   (in_RDX + (int)((uint)*(byte *)(in_RSI + 0x18) + (uint)node->key[0])),
                  (int3)in_stack_ffffffffffffffd0);
    art_ref_typecode(in_RDI);
    first = (undefined1)(in_RDI >> 0x38);
    in_stack_ffffffffffffffc0 =
         art_node_lower_bound(node,in_stack_ffffffffffffffaf,in_stack_ffffffffffffffae);
    if (in_stack_ffffffffffffffc0.child == 0) break;
    if ((byte)((uint)in_stack_ffffffffffffffd0 >> 0x18) < in_stack_ffffffffffffffc0.key_chunk) {
      art_iterator_down((art_iterator_t *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc0._8_8_,in_stack_ffffffffffffffc0.child._7_1_);
      _Var1 = art_node_init_iterator
                        (unaff_retaddr,
                         (art_iterator_t *)
                         CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(_Bool)first)
      ;
      return _Var1;
    }
    art_iterator_down((art_iterator_t *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc0._8_8_,in_stack_ffffffffffffffc0.child._7_1_);
    in_RDI = in_stack_ffffffffffffffc0.child;
    in_stack_ffffffffffffffb0 = node;
  }
  _Var1 = art_iterator_up_and_move
                    ((art_iterator_t *)
                     CONCAT17(in_stack_ffffffffffffffaf,
                              CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)),false);
  return _Var1;
}

Assistant:

static bool art_node_iterator_lower_bound(art_ref_t ref,
                                          art_iterator_t *iterator,
                                          const art_key_chunk_t key[]) {
    while (!art_is_leaf(ref)) {
        art_inner_node_t *inner_node =
            (art_inner_node_t *)art_deref(iterator->art, ref);
        int prefix_comparison =
            art_compare_prefix(inner_node->prefix, 0, key, iterator->depth,
                               inner_node->prefix_size);
        if (prefix_comparison < 0) {
            // Prefix so far has been equal, but we've found a smaller key.
            // Since we take the lower bound within each node, we can return
            // the next leaf.
            return art_iterator_up_and_move(iterator, true);
        } else if (prefix_comparison > 0) {
            // No key equal to the key we're looking for, return the first
            // leaf.
            return art_node_init_iterator(ref, iterator, true);
        }
        // Prefix is equal, move to lower bound child.
        art_key_chunk_t key_chunk =
            key[iterator->depth + inner_node->prefix_size];
        art_indexed_child_t indexed_child = art_node_lower_bound(
            (art_node_t *)inner_node, art_ref_typecode(ref), key_chunk);
        if (indexed_child.child == CROARING_ART_NULL_REF) {
            // Only smaller keys among children.
            return art_iterator_up_and_move(iterator, true);
        }
        if (indexed_child.key_chunk > key_chunk) {
            // Only larger children, return the first larger child.
            art_iterator_down(iterator, ref, indexed_child.index);
            return art_node_init_iterator(indexed_child.child, iterator, true);
        }
        // We found a child with an equal prefix.
        art_iterator_down(iterator, ref, indexed_child.index);
        ref = indexed_child.child;
    }
    art_leaf_t *leaf = (art_leaf_t *)art_deref(iterator->art, ref);
    if (art_compare_keys(leaf->key, key) >= 0) {
        // Leaf has an equal or larger key.
        return art_iterator_valid_loc(iterator, ref);
    }
    // Leaf has an equal prefix, but the full key is smaller. Move to the
    // next leaf.
    return art_iterator_up_and_move(iterator, true);
}